

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int ncnn::convolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  undefined4 in_stack_00000030;
  Mat *in_stack_00000038;
  float w_2;
  float val_1;
  int k_1;
  float *sptr_1;
  Mat m_1;
  int q;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int outch_g;
  int inch_g;
  float w_1;
  float val;
  int k;
  float *sptr;
  float sum;
  int j_1;
  int i_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int bias_term;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  undefined4 in_stack_fffffffffffffce0;
  float fVar8;
  undefined4 in_stack_fffffffffffffce4;
  allocator_type *in_stack_fffffffffffffcf0;
  size_type in_stack_fffffffffffffcf8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd00;
  Mat *in_stack_fffffffffffffd08;
  float local_2e4;
  int local_29c;
  Mat local_290;
  int local_244;
  float *local_240;
  float local_234;
  int local_230;
  int local_22c;
  float *local_228;
  Mat local_220;
  Mat *local_1d8;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  float local_1bc;
  float local_1b8;
  int local_1b4;
  float *local_1b0;
  float local_1a4;
  int local_1a0;
  int local_19c;
  Mat local_198;
  float *local_150;
  Mat local_148;
  float *local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  reference local_e0;
  vector<int,_std::allocator<int>_> local_c0;
  int local_a4;
  uint local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  Mat *local_80;
  Mat *local_78;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  Mat *local_40;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  Mat *local_10;
  float local_4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_8c = *(int *)(in_RDI + 0x2c);
  local_90 = *(int *)(in_RDI + 0x38);
  local_94 = *(int *)(in_RSI + 0x2c);
  local_98 = *(int *)(in_RSI + 0x30);
  local_9c = *(int *)(in_RSI + 0x38);
  local_88 = in_R9D;
  local_84 = in_R8D;
  local_80 = in_RCX;
  local_78 = in_RDX;
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  local_a0 = (uint)!bVar1;
  local_a4 = local_84 * local_88;
  std::allocator<int>::allocator((allocator<int> *)0x60f96b);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::allocator<int>::~allocator((allocator<int> *)0x60f991);
  local_e0 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,0);
  local_e4 = 0;
  local_e8 = 0;
  local_ec = local_8c * in_stack_00000020 - local_84 * in_stack_00000018;
  for (local_f0 = 0; local_f0 < local_88; local_f0 = local_f0 + 1) {
    for (local_f4 = 0; local_f4 < local_84; local_f4 = local_f4 + 1) {
      local_e0[local_e4] = local_e8;
      local_e4 = local_e4 + 1;
      local_e8 = in_stack_00000018 + local_e8;
    }
    local_e8 = local_ec + local_e8;
  }
  if ((local_90 == in_stack_00000028) && (in_stack_00000028 == local_9c)) {
    for (local_f8 = 0; local_f8 < in_stack_00000028; local_f8 = local_f8 + 1) {
      Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
      pfVar2 = Mat::operator_cast_to_float_(&local_148);
      Mat::~Mat((Mat *)0x60fb4b);
      local_100 = pfVar2;
      local_150 = Mat::operator_cast_to_float_(local_78);
      local_150 = local_150 + local_a4 * local_f8;
      Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
      for (local_19c = 0; local_19c < local_98; local_19c = local_19c + 1) {
        for (local_1a0 = 0; local_1a0 < local_94; local_1a0 = local_1a0 + 1) {
          local_1a4 = 0.0;
          if (local_a0 != 0) {
            pfVar2 = Mat::operator[](local_80,(long)local_f8);
            local_1a4 = *pfVar2;
          }
          local_1b0 = Mat::row(&local_198,local_19c * in_stack_00000010);
          local_1b0 = local_1b0 + local_1a0 * in_stack_00000008;
          for (local_1b4 = 0; fVar8 = local_1a4, local_1b4 < local_a4; local_1b4 = local_1b4 + 1) {
            local_1b8 = local_1b0[local_e0[local_1b4]];
            local_1bc = local_150[local_1b4];
            local_1a4 = local_1b8 * local_1bc + local_1a4;
          }
          local_4 = local_1a4;
          local_10 = in_stack_00000038;
          switch(in_stack_00000030) {
          case 1:
            dVar3 = std::fmax((double)(ulong)(uint)local_1a4,0.0);
            local_4 = SUB84(dVar3,0);
            break;
          case 2:
            pfVar2 = Mat::operator[](in_stack_00000038,0);
            local_14 = *pfVar2;
            if (local_4 <= 0.0) {
              local_2e4 = local_4 * local_14;
            }
            else {
              local_2e4 = local_4;
            }
            local_4 = local_2e4;
            break;
          case 3:
            pfVar2 = Mat::operator[](in_stack_00000038,0);
            local_18 = *pfVar2;
            pfVar2 = Mat::operator[](local_10,1);
            local_1c = *pfVar2;
            if (local_4 < local_18) {
              local_4 = local_18;
            }
            if (local_1c < local_4) {
              local_4 = local_1c;
            }
            break;
          case 4:
            dVar3 = std::exp((double)(ulong)(uint)-local_1a4);
            local_4 = 1.0 / (SUB84(dVar3,0) + 1.0);
            break;
          case 5:
            auVar4._0_8_ = std::exp((double)(ulong)(uint)local_1a4);
            auVar4._8_8_ = extraout_XMM0_Qb;
            auVar5._4_12_ = auVar4._4_12_;
            auVar5._0_4_ = SUB84(auVar4._0_8_,0) + 1.0;
            dVar3 = std::log(auVar5._0_8_);
            dVar3 = std::tanh(dVar3);
            local_4 = fVar8 * SUB84(dVar3,0);
            break;
          case 6:
            pfVar2 = Mat::operator[](in_stack_00000038,0);
            local_20 = *pfVar2;
            pfVar2 = Mat::operator[](local_10,1);
            local_24 = *pfVar2;
            local_28 = -local_24 / local_20;
            local_2c = 1.0 / local_20 + local_28;
            if (local_28 <= local_4) {
              if (local_4 <= local_2c) {
                local_4 = local_4 * (local_4 * local_20 + local_24);
              }
            }
            else {
              local_4 = 0.0;
            }
          }
          local_100[local_1a0] = local_4;
        }
        local_100 = local_100 + local_94;
      }
      Mat::~Mat((Mat *)0x61010b);
    }
  }
  else {
    local_1c0 = local_90 / in_stack_00000028;
    local_1c4 = local_9c / in_stack_00000028;
    for (local_1c8 = 0; local_1c8 < in_stack_00000028; local_1c8 = local_1c8 + 1) {
      for (local_1cc = 0; local_1cc < local_1c4; local_1cc = local_1cc + 1) {
        Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
        in_stack_fffffffffffffd08 = (Mat *)Mat::operator_cast_to_float_(&local_220);
        Mat::~Mat((Mat *)0x6101e2);
        local_1d8 = in_stack_fffffffffffffd08;
        in_stack_fffffffffffffd00 =
             (vector<int,_std::allocator<int>_> *)Mat::operator_cast_to_float_(local_78);
        local_228 = (float *)((long)&(in_stack_fffffffffffffd00->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start +
                             (long)(local_a4 * local_1c0 * local_1c4 * local_1c8) * 4);
        for (local_22c = 0; local_22c < local_98; local_22c = local_22c + 1) {
          for (local_230 = 0; local_230 < local_94; local_230 = local_230 + 1) {
            local_234 = 0.0;
            if (local_a0 != 0) {
              pfVar2 = Mat::operator[](local_80,(long)(local_1c4 * local_1c8 + local_1cc));
              local_234 = *pfVar2;
            }
            local_240 = local_228 + local_a4 * local_1c0 * local_1cc;
            for (local_244 = 0; local_244 < local_1c0; local_244 = local_244 + 1) {
              Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20)
                          );
              in_stack_fffffffffffffcf0 =
                   (allocator_type *)Mat::row(&local_290,local_22c * in_stack_00000010);
              for (local_29c = 0; local_29c < local_a4; local_29c = local_29c + 1) {
                local_234 = *(float *)(in_stack_fffffffffffffcf0 +
                                      (long)local_e0[local_29c] * 4 +
                                      (long)(local_230 * in_stack_00000008) * 4) *
                            local_240[local_29c] + local_234;
              }
              local_240 = local_240 + local_a4;
              Mat::~Mat((Mat *)0x6104b9);
            }
            local_30 = local_234;
            local_40 = in_stack_00000038;
            switch(in_stack_00000030) {
            case 1:
              dVar3 = std::fmax((double)(ulong)(uint)local_234,0.0);
              local_30 = SUB84(dVar3,0);
              break;
            case 2:
              pfVar2 = Mat::operator[](in_stack_00000038,0);
              local_44 = *pfVar2;
              if (local_30 <= 0.0) {
                local_30 = local_30 * local_44;
              }
              break;
            case 3:
              pfVar2 = Mat::operator[](in_stack_00000038,0);
              local_48 = *pfVar2;
              pfVar2 = Mat::operator[](local_40,1);
              local_4c = *pfVar2;
              if (local_30 < local_48) {
                local_30 = local_48;
              }
              if (local_4c < local_30) {
                local_30 = local_4c;
              }
              break;
            case 4:
              dVar3 = std::exp((double)(ulong)(uint)-local_234);
              local_30 = 1.0 / (SUB84(dVar3,0) + 1.0);
              break;
            case 5:
              fVar8 = local_234;
              auVar6._0_8_ = std::exp((double)(ulong)(uint)local_234);
              auVar6._8_8_ = extraout_XMM0_Qb_00;
              auVar7._4_12_ = auVar6._4_12_;
              auVar7._0_4_ = SUB84(auVar6._0_8_,0) + 1.0;
              dVar3 = std::log(auVar7._0_8_);
              dVar3 = std::tanh(dVar3);
              local_30 = fVar8 * SUB84(dVar3,0);
              break;
            case 6:
              pfVar2 = Mat::operator[](in_stack_00000038,0);
              local_50 = *pfVar2;
              pfVar2 = Mat::operator[](local_40,1);
              local_54 = *pfVar2;
              local_58 = -local_54 / local_50;
              local_5c = 1.0 / local_50 + local_58;
              if (local_58 <= local_30) {
                if (local_30 <= local_5c) {
                  local_30 = local_30 * (local_30 * local_50 + local_54);
                }
              }
              else {
                local_30 = 0.0;
              }
            }
            *(float *)((long)&local_1d8->data + (long)local_230 * 4) = local_30;
          }
          local_1d8 = (Mat *)((long)&local_1d8->data + (long)local_94 * 4);
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0);
  return 0;
}

Assistant:

static int convolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }
    else
    {
        // group convolution
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                float* outptr = top_blob.channel(g * outch_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

#if NCNN_SIMPLEOMP
                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
#endif

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[outch_g * g + p];

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const Mat m = bottom_blob.channel(inch_g * g + q);
                            const float* sptr = m.row(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                float val = sptr[space_ofs[k]];
                                float w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}